

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::exception::eval_error::format_parameters_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_parameters,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  Dispatch_Engine *this_00;
  bool bVar1;
  pointer this_01;
  reference obj;
  size_type sVar2;
  size_type sVar3;
  undefined7 in_register_00000009;
  char *__s;
  byte local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_218;
  string local_210;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_1f0;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_1e8;
  const_iterator itr;
  string paramstr;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  Dispatch_Engine *local_28;
  Dispatch_Engine *t_ss_local;
  eval_error *peStack_18;
  bool t_dot_notation_local;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_parameters_local;
  
  local_28 = (Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation);
  t_ss_local._7_1_ = (byte)t_parameters & 1;
  peStack_18 = this;
  t_parameters_local =
       (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
       __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,"(");
  bVar1 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::empty
                    ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                     peStack_18);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&itr);
    local_1e8._M_current =
         (Boxed_Value *)
         std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                   ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                    peStack_18);
    while( true ) {
      local_1f0._M_current =
           (Boxed_Value *)
           std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                     ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                      peStack_18);
      bVar1 = __gnu_cxx::
              operator==<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        (&local_1e8,&local_1f0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      this_01 = __gnu_cxx::
                __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                ::operator->(&local_1e8);
      bVar1 = Boxed_Value::is_const(this_01);
      __s = "";
      if (bVar1) {
        __s = "const ";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr,__s);
      this_00 = local_28;
      obj = __gnu_cxx::
            __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
            ::operator*(&local_1e8);
      detail::Dispatch_Engine::type_name_abi_cxx11_(&local_210,this_00,obj);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr,
                 &local_210);
      std::__cxx11::string::~string((string *)&local_210);
      local_218._M_current =
           (Boxed_Value *)
           std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                     ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                      peStack_18);
      bVar1 = __gnu_cxx::
              operator==<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                        (&local_1e8,&local_218);
      local_251 = 0;
      if (bVar1) {
        local_251 = t_ss_local._7_1_;
      }
      if ((local_251 & 1) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr,", ");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr,").(");
        sVar2 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::size
                          ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                            *)peStack_18);
        if (sVar2 == 1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr,", ")
          ;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
      ::operator++(&local_1e8);
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itr,
               0,sVar3 - 2);
    std::operator<<(local_1a0,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&itr);
  }
  std::operator<<(local_1a0,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string
      format_parameters(const std::vector<Boxed_Value> &t_parameters, bool t_dot_notation, const chaiscript::detail::Dispatch_Engine &t_ss) {
        std::stringstream ss;
        ss << "(";

        if (!t_parameters.empty()) {
          std::string paramstr;

          for (auto itr = t_parameters.begin(); itr != t_parameters.end(); ++itr) {
            paramstr += (itr->is_const() ? "const " : "");
            paramstr += t_ss.type_name(*itr);

            if (itr == t_parameters.begin() && t_dot_notation) {
              paramstr += ").(";
              if (t_parameters.size() == 1) {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);
        }
        ss << ")";

        return ss.str();
      }